

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall
testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Matcher(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,char *s)

{
  allocator local_69;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_50 [32];
  string local_30 [32];
  
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.value_ =
       (MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).impl_.link_.next_ =
       &(this->
        super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).impl_.link_;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00162978;
  std::__cxx11::string::string(local_50,s,&local_69);
  std::__cxx11::string::string(local_30,local_50);
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_68,(EqMatcher *)local_30);
  internal::
  linked_ptr<const_testing::MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->
               super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).impl_,&local_68.impl_);
  internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_68);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

Matcher<internal::string>::Matcher(const char* s) {
  *this = Eq(internal::string(s));
}